

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O3

config * Configlist_addbasis(rule *rp,int dot)

{
  config *data;
  char *pcVar1;
  config model;
  config local_60;
  
  local_60.rp = rp;
  local_60.dot = dot;
  data = Configtable_find(&local_60);
  if (data == (config *)0x0) {
    data = newconfig();
    data->rp = rp;
    data->dot = dot;
    pcVar1 = SetNew();
    data->fws = pcVar1;
    data->fplp = (plink *)0x0;
    data->bplp = (plink *)0x0;
    data->stp = (state *)0x0;
    data->next = (config *)0x0;
    data->bp = (config *)0x0;
    *currentend = data;
    currentend = &data->next;
    *basisend = data;
    basisend = &data->bp;
    Configtable_insert(data);
  }
  return data;
}

Assistant:

struct config *Configlist_addbasis(struct rule *rp, int dot)
{
  struct config *cfp, model;

  assert( basisend!=0 );
  assert( currentend!=0 );
  model.rp = rp;
  model.dot = dot;
  cfp = Configtable_find(&model);
  if( cfp==0 ){
    cfp = newconfig();
    cfp->rp = rp;
    cfp->dot = dot;
    cfp->fws = SetNew();
    cfp->stp = 0;
    cfp->fplp = cfp->bplp = 0;
    cfp->next = 0;
    cfp->bp = 0;
    *currentend = cfp;
    currentend = &cfp->next;
    *basisend = cfp;
    basisend = &cfp->bp;
    Configtable_insert(cfp);
  }
  return cfp;
}